

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall AActorMover::Deactivate(AActorMover *this,AActor *activator)

{
  bool bVar1;
  AActor *pAVar2;
  TFlags<ActorFlag2,_unsigned_int> local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *activator_local;
  AActorMover *this_local;
  
  if (((this->super_APathFollower).super_AActor.field_0x499 & 1) != 0) {
    local_18 = activator;
    activator_local = (AActor *)this;
    APathFollower::Deactivate(&this->super_APathFollower,activator);
    bVar1 = TObjPtr<AActor>::operator!=
                      (&(this->super_APathFollower).super_AActor.tracer,(AActor *)0x0);
    if (bVar1) {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
      AActor::UnlinkFromWorld(pAVar2);
      TFlags<ActorFlag,_unsigned_int>::FromInt
                (&local_1c,(this->super_APathFollower).super_AActor.special1);
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
      TFlags<ActorFlag,_unsigned_int>::operator=(&pAVar2->flags,&local_1c);
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
      AActor::LinkToWorld(pAVar2,false,(sector_t *)0x0);
      TFlags<ActorFlag2,_unsigned_int>::FromInt
                (&local_20,(this->super_APathFollower).super_AActor.special2);
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
      TFlags<ActorFlag2,_unsigned_int>::operator=(&pAVar2->flags2,&local_20);
    }
  }
  return;
}

Assistant:

void AActorMover::Deactivate (AActor *activator)
{
	if (bActive)
	{
		Super::Deactivate (activator);
		if (tracer != NULL)
		{
			tracer->UnlinkFromWorld ();
			tracer->flags = ActorFlags::FromInt (special1);
			tracer->LinkToWorld ();
			tracer->flags2 = ActorFlags2::FromInt (special2);
		}
	}
}